

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_tess_level_input
          (CompilerMSL *this,string *base_ref,string *mbr_name,SPIRVariable *var)

{
  uint32_t id;
  SPIRFunction *this_00;
  anon_class_112_5_3b61e443 local_198;
  function<void_()> local_128;
  anon_class_112_5_310756a6 local_108;
  function<void_()> local_98;
  byte local_75;
  uint32_t local_74;
  TypedID<(spirv_cross::Types)2> TStack_70;
  bool triangles;
  uint32_t local_5c;
  undefined1 local_58 [8];
  string var_name;
  BuiltIn builtin;
  SPIRFunction *entry_func;
  SPIRVariable *var_local;
  string *mbr_name_local;
  string *base_ref_local;
  CompilerMSL *this_local;
  
  id = TypedID::operator_cast_to_unsigned_int
                 ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  this_00 = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,id);
  var_name.field_2._8_4_ = (var->super_IVariant).self.id;
  var_name.field_2._12_4_ =
       Compiler::get_decoration((Compiler *)this,(ID)var_name.field_2._8_4_,DecorationBuiltIn);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
            ((string *)local_58,this,(ulong)(uint)var_name.field_2._12_4_,7);
  local_5c = (var->super_IVariant).self.id;
  Compiler::set_name((Compiler *)this,(ID)local_5c,(string *)local_58);
  TStack_70 = TypedID::operator_cast_to_TypedID((TypedID *)&(var->super_IVariant).self);
  SPIRFunction::add_local_variable(this_00,(VariableID)TStack_70.id);
  local_74 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  SmallVector<unsigned_int,_8UL>::push_back(&this->vars_needing_early_declaration,&local_74);
  local_75 = Compiler::is_tessellating_triangles((Compiler *)this);
  if (var_name.field_2._12_4_ == 0xb) {
    local_108.this = this;
    ::std::__cxx11::string::string((string *)&local_108.var_name,(string *)local_58);
    ::std::__cxx11::string::string((string *)&local_108.base_ref,(string *)base_ref);
    ::std::__cxx11::string::string((string *)&local_108.mbr_name,(string *)mbr_name);
    local_108.triangles = (bool)(local_75 & 1);
    ::std::function<void()>::
    function<spirv_cross::CompilerMSL::add_tess_level_input(std::__cxx11::string_const&,std::__cxx11::string_const&,spirv_cross::SPIRVariable&)::__0,void>
              ((function<void()> *)&local_98,&local_108);
    SmallVector<std::function<void_()>,_0UL>::push_back(&this_00->fixup_hooks_in,&local_98);
    ::std::function<void_()>::~function(&local_98);
    add_tess_level_input(std::__cxx11::string_const&,std::__cxx11::string_const&,spirv_cross::SPIRVariable&)
    ::$_0::~__0((__0 *)&local_108);
  }
  else {
    local_198.triangles = (bool)local_75;
    local_198.this = this;
    ::std::__cxx11::string::string((string *)&local_198.var_name,(string *)local_58);
    ::std::__cxx11::string::string((string *)&local_198.base_ref,(string *)base_ref);
    ::std::__cxx11::string::string((string *)&local_198.mbr_name,(string *)mbr_name);
    ::std::function<void()>::
    function<spirv_cross::CompilerMSL::add_tess_level_input(std::__cxx11::string_const&,std::__cxx11::string_const&,spirv_cross::SPIRVariable&)::__1,void>
              ((function<void()> *)&local_128,&local_198);
    SmallVector<std::function<void_()>,_0UL>::push_back(&this_00->fixup_hooks_in,&local_128);
    ::std::function<void_()>::~function(&local_128);
    add_tess_level_input(std::__cxx11::string_const&,std::__cxx11::string_const&,spirv_cross::SPIRVariable&)
    ::$_1::~__1((__1 *)&local_198);
  }
  ::std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void CompilerMSL::add_tess_level_input(const std::string &base_ref, const std::string &mbr_name, SPIRVariable &var)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));

	// Force the variable to have the proper name.
	string var_name = builtin_to_glsl(builtin, StorageClassFunction);
	set_name(var.self, var_name);

	// We need to declare the variable early and at entry-point scope.
	entry_func.add_local_variable(var.self);
	vars_needing_early_declaration.push_back(var.self);
	bool triangles = is_tessellating_triangles();

	if (builtin == BuiltInTessLevelOuter)
	{
		entry_func.fixup_hooks_in.push_back(
		    [=]()
		    {
			    statement(var_name, "[0] = ", base_ref, ".", mbr_name, "[0];");
			    statement(var_name, "[1] = ", base_ref, ".", mbr_name, "[1];");
			    statement(var_name, "[2] = ", base_ref, ".", mbr_name, "[2];");
			    if (!triangles)
				    statement(var_name, "[3] = ", base_ref, ".", mbr_name, "[3];");
		    });
	}
	else
	{
		entry_func.fixup_hooks_in.push_back([=]() {
			if (triangles)
			{
				if (msl_options.raw_buffer_tese_input)
					statement(var_name, "[0] = ", base_ref, ".", mbr_name, ";");
				else
					statement(var_name, "[0] = ", base_ref, ".", mbr_name, "[3];");
			}
			else
			{
				statement(var_name, "[0] = ", base_ref, ".", mbr_name, "[0];");
				statement(var_name, "[1] = ", base_ref, ".", mbr_name, "[1];");
			}
		});
	}
}